

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O2

vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
* get_primes<libdivide::divider<short,(libdivide::Branching)1>,short>
            (vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
             *__return_storage_ptr__,short max)

{
  short sVar1;
  short sVar2;
  ushort uVar3;
  size_t i;
  long lVar4;
  size_t j;
  ulong uVar5;
  undefined6 in_register_00000032;
  ushort uVar6;
  ulong uVar7;
  divider<short,_(libdivide::Branching)1> local_44;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> sieve;
  
  uVar7 = (ulong)(int)CONCAT62(in_register_00000032,max);
  local_44.div.denom.magic = CONCAT11(local_44.div.denom.magic._1_1_,1);
  std::vector<char,_std::allocator<char>_>::vector
            (&sieve,uVar7 + 1,(value_type *)&local_44,&local_41);
  for (lVar4 = 2; uVar5 = lVar4 * lVar4, uVar5 < uVar7 || uVar5 - uVar7 == 0; lVar4 = lVar4 + 1) {
    if (sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar4] != '\0') {
      for (; uVar5 <= uVar7; uVar5 = uVar5 + lVar4) {
        sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = '\0';
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 2;
  do {
    if (uVar7 < uVar5) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&sieve.super__Vector_base<char,_std::allocator<char>_>);
      return __return_storage_ptr__;
    }
    if (sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] != '\0') {
      uVar6 = (ushort)uVar5;
      if (uVar6 == 0) {
        fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
                "divider must be != 0");
        abort();
      }
      uVar3 = -uVar6;
      if (0 < (short)uVar6) {
        uVar3 = uVar6;
      }
      local_44.div.denom.more = (uint8_t)(LZCOUNT(uVar3) ^ 0xfU);
      if ((uVar3 - 1 & uVar3) == 0) {
        local_44.div.denom.more = local_44.div.denom.more | (byte)(uVar5 >> 8) & 0x80;
        local_44.div.denom.magic = 0;
      }
      else {
        sVar2 = (short)((uint)(0x8000 << (LZCOUNT(uVar3) ^ 0xfU)) / (uint)uVar3);
        sVar1 = uVar3 * sVar2;
        local_44.div.denom.more = ((-1 < (short)uVar6) << 7 | local_44.div.denom.more) - 0x40;
        local_44.div.denom.magic = (0 < sVar1 || uVar3 <= (ushort)(sVar1 * -2)) + 1 + sVar2 * 2;
      }
      std::
      vector<libdivide::divider<short,(libdivide::Branching)1>,std::allocator<libdivide::divider<short,(libdivide::Branching)1>>>
      ::emplace_back<libdivide::divider<short,(libdivide::Branching)1>>
                ((vector<libdivide::divider<short,(libdivide::Branching)1>,std::allocator<libdivide::divider<short,(libdivide::Branching)1>>>
                  *)__return_storage_ptr__,&local_44);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}